

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

void __thiscall libtorrent::dht::node::update_node_id(node *this)

{
  node_id *nid;
  dht_observer *pdVar1;
  undefined8 uVar2;
  bool bVar3;
  address ext_address;
  address local_50;
  node_id local_2c;
  
  if (this->m_observer != (dht_observer *)0x0) {
    aux::listen_socket_handle::get_external_address(&local_50,&this->m_sock);
    nid = &this->m_id;
    bVar3 = verify_id(nid,&local_50);
    if (!bVar3) {
      pdVar1 = this->m_observer;
      if (pdVar1 != (dht_observer *)0x0) {
        (*(pdVar1->super_dht_logger)._vptr_dht_logger[1])
                  (pdVar1,1,"updating node ID (because external IP address changed)");
      }
      generate_id(&local_2c,&local_50);
      (this->m_id).m_number._M_elems[4] = local_2c.m_number._M_elems[4];
      *(undefined8 *)(nid->m_number)._M_elems = local_2c.m_number._M_elems._0_8_;
      *(undefined8 *)((this->m_id).m_number._M_elems + 2) = local_2c.m_number._M_elems._8_8_;
      routing_table::update_node_id(&this->m_table,nid);
      (this->m_rpc).m_our_id.m_number._M_elems[4] = (this->m_id).m_number._M_elems[4];
      uVar2 = *(undefined8 *)((this->m_id).m_number._M_elems + 2);
      *(undefined8 *)(this->m_rpc).m_our_id.m_number._M_elems =
           *(undefined8 *)(nid->m_number)._M_elems;
      *(undefined8 *)((this->m_rpc).m_our_id.m_number._M_elems + 2) = uVar2;
    }
  }
  return;
}

Assistant:

void node::update_node_id()
{
	// if we don't have an observer, we can't ask for the external IP (and our
	// current node ID is likely not generated from an external address), so we
	// can just stop here in that case.
	if (m_observer == nullptr) return;

	auto ext_address = m_sock.get_external_address();

	// it's possible that our external address hasn't actually changed. If our
	// current ID is still valid, don't do anything.
	if (verify_id(m_id, ext_address))
		return;

#ifndef TORRENT_DISABLE_LOGGING
	if (m_observer != nullptr) m_observer->log(dht_logger::node
		, "updating node ID (because external IP address changed)");
#endif

	m_id = generate_id(ext_address);

	m_table.update_node_id(m_id);
	m_rpc.update_node_id(m_id);
}